

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_util.cc
# Opt level: O2

void tvm::runtime::ImportModuleBlob
               (char *mblob,
               vector<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_> *mlist)

{
  bool bVar1;
  ostream *poVar2;
  size_t sVar3;
  PackedFunc *args;
  long lVar4;
  byte *pbVar5;
  ulong uVar6;
  uint64_t size;
  string tkey;
  undefined1 local_208 [16];
  MemoryFixedSizeStream fs;
  string fkey;
  Module m;
  
  if (mblob == (char *)0x0) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&m,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module_util.cc"
               ,0x27);
    poVar2 = std::operator<<((ostream *)&m,"Check failed: mblob != nullptr");
    std::operator<<(poVar2,": ");
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&m);
  }
  fs.buffer_size_ = 0;
  pbVar5 = (byte *)mblob;
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 8) {
    fs.buffer_size_ = fs.buffer_size_ | (ulong)*pbVar5 << ((byte)lVar4 & 0x3f);
    pbVar5 = pbVar5 + 1;
  }
  fs.p_buffer_ = mblob + 8;
  fs.super_SeekStream.super_Stream._vptr_Stream = (Stream)&PTR_Read_001437d0;
  fs.curr_ptr_ = 0;
  sVar3 = dmlc::MemoryFixedSizeStream::Read(&fs,&size,8);
  if (sVar3 != 8) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&m,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module_util.cc"
               ,0x31);
    poVar2 = std::operator<<((ostream *)&m,"Check failed: stream->Read(&size)");
    std::operator<<(poVar2,": ");
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&m);
  }
  for (uVar6 = 0; uVar6 < size; uVar6 = uVar6 + 1) {
    tkey._M_dataplus._M_p = (pointer)&tkey.field_2;
    tkey._M_string_length = 0;
    tkey.field_2._M_local_buf[0] = '\0';
    bVar1 = dmlc::serializer::NativePODStringHandler<char>::Read((Stream *)&fs,&tkey);
    if (!bVar1) {
      dmlc::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&m,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module_util.cc"
                 ,0x34);
      poVar2 = std::operator<<((ostream *)&m,"Check failed: stream->Read(&tkey)");
      std::operator<<(poVar2,": ");
      dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&m);
    }
    std::operator+(&fkey,"module.loadbinary_",&tkey);
    args = Registry::Get(&fkey);
    if (args == (PackedFunc *)0x0) {
      dmlc::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&m,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module_util.cc"
                 ,0x37);
      poVar2 = std::operator<<((ostream *)&m,"Check failed: f != nullptr");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2,"Loader of ");
      poVar2 = std::operator<<(poVar2,(string *)&tkey);
      poVar2 = std::operator<<(poVar2,"(");
      poVar2 = std::operator<<(poVar2,(string *)&fkey);
      std::operator<<(poVar2,") is not presented.");
      dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&m);
    }
    PackedFunc::operator()((PackedFunc *)local_208,(void **)args);
    TVMRetValue::operator_cast_to_Module((TVMRetValue *)&m);
    TVMRetValue::~TVMRetValue((TVMRetValue *)local_208);
    std::vector<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_>::push_back
              (mlist,(value_type *)&m);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&m.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&fkey);
    std::__cxx11::string::~string((string *)&tkey);
  }
  return;
}

Assistant:

void ImportModuleBlob(const char *mblob, std::vector<Module> *mlist) {
#ifndef _LIBCPP_SGX_CONFIG
  CHECK(mblob != nullptr);
  uint64_t nbytes = 0;
  for (size_t i = 0; i < sizeof(nbytes); ++i) {
    uint64_t c = mblob[i];
    nbytes |= (c & 0xffUL) << (i * 8);
  }
  dmlc::MemoryFixedSizeStream fs(
      const_cast<char *>(mblob + sizeof(nbytes)), static_cast<size_t>(nbytes));
  dmlc::Stream *stream = &fs;
  uint64_t size;
  CHECK(stream->Read(&size));
  for (uint64_t i = 0; i < size; ++i) {
    std::string tkey;
    CHECK(stream->Read(&tkey));
    std::string fkey = "module.loadbinary_" + tkey;
    const PackedFunc *f = Registry::Get(fkey);
    CHECK(f != nullptr)
        << "Loader of " << tkey << "("
        << fkey << ") is not presented.";
    Module m = (*f)(static_cast<void *>(stream));
    mlist->push_back(m);
  }
#else
  LOG(FATAL) << "SGX does not support ImportModuleBlob";
#endif
}